

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

float nk_font_text_width(nk_handle handle,float height,char *text,int len)

{
  int iVar1;
  int iVar2;
  nk_font_glyph *pnVar3;
  nk_rune unicode;
  float local_34;
  nk_rune local_30;
  float local_2c;
  
  local_34 = 0.0;
  if (len != 0 && (text != (char *)0x0 && handle.ptr != (void *)0x0)) {
    local_2c = height / *(float *)((long)handle.ptr + 0x30);
    iVar1 = nk_utf_decode(text,&local_30,len);
    if (iVar1 <= len && iVar1 != 0) {
      local_34 = 0.0;
      while (local_30 != 0xfffd) {
        pnVar3 = nk_font_find_glyph((nk_font *)handle.ptr,local_30);
        local_34 = local_34 + pnVar3->xadvance * local_2c;
        iVar2 = nk_utf_decode(text + iVar1,&local_30,len - iVar1);
        iVar1 = iVar1 + iVar2;
        if (len < iVar1) {
          return local_34;
        }
        if (iVar2 == 0) {
          return local_34;
        }
      }
    }
  }
  return local_34;
}

Assistant:

NK_INTERN float
nk_font_text_width(nk_handle handle, float height, const char *text, int len)
{
nk_rune unicode;
int text_len  = 0;
float text_width = 0;
int glyph_len = 0;
float scale = 0;

struct nk_font *font = (struct nk_font*)handle.ptr;
NK_ASSERT(font);
NK_ASSERT(font->glyphs);
if (!font || !text || !len)
return 0;

scale = height/font->info.height;
glyph_len = text_len = nk_utf_decode(text, &unicode, (int)len);
if (!glyph_len) return 0;
while (text_len <= (int)len && glyph_len) {
const struct nk_font_glyph *g;
if (unicode == NK_UTF_INVALID) break;

/* query currently drawn glyph information */
g = nk_font_find_glyph(font, unicode);
text_width += g->xadvance * scale;

/* offset next glyph */
glyph_len = nk_utf_decode(text + text_len, &unicode, (int)len - text_len);
text_len += glyph_len;
}
return text_width;
}